

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifsct(bifcxdef *bifctx,int argc)

{
  ushort uVar1;
  ushort uVar2;
  runcxdef *ctx;
  runsdef *prVar3;
  anon_union_8_4_1dda36f5_for_runsv aVar4;
  uchar *puVar5;
  ushort *__src;
  uint uVar6;
  int iVar7;
  uint16_t tmp;
  uint uVar8;
  ulong __n;
  uint uVar9;
  ushort *puVar10;
  uint siz1;
  uchar *l1;
  uint l;
  uchar *p;
  runsdef stk2;
  runsdef stk1;
  runsdef val;
  uint local_8c;
  anon_union_8_4_1dda36f5_for_runsv local_88;
  uint local_80;
  uint local_7c;
  uchar *local_78;
  ushort *local_70;
  runcxdef *local_68;
  runsdef local_60;
  runsdef local_50;
  runsdef local_40;
  
  ctx = bifctx->bifcxrun;
  prVar3 = ctx->runcxsp;
  ctx->runcxsp = prVar3 + -1;
  if (prVar3[-1].runstyp == '\a') {
    local_88 = (anon_union_8_4_1dda36f5_for_runsv)prVar3[-1].runsv.runsvstr;
    uVar1 = *(ushort *)local_88.runsvstr;
    local_8c = (uint)uVar1;
    ctx->runcxsp = prVar3 + -2;
    if (prVar3[-2].runstyp == '\a') {
      aVar4 = (anon_union_8_4_1dda36f5_for_runsv)prVar3[-2].runsv.runsvstr;
      uVar2 = *(ushort *)aVar4.runsvstr;
      local_60.runsv = aVar4;
      uVar9 = (uint)uVar2;
      if (uVar2 < uVar1) {
        local_60.runsv = local_88;
        uVar9 = local_8c;
        local_8c = (uint)uVar2;
        local_88 = aVar4;
      }
      local_60.runstyp = '\a';
      local_50.runstyp = '\a';
      local_50.runsv.runsvnum = local_88.runsvnum;
      if ((uint)(*(int *)&ctx->runcxhtop - *(int *)&ctx->runcxhp) <= local_8c) {
        runhcmp(ctx,local_8c,2,&local_50,&local_60,(runsdef *)0x0);
      }
      local_78 = ctx->runcxhp + 2;
      local_88.runsvstr = (uchar *)(local_50.runsv.runsvnum + 2);
      local_8c = local_8c - 2;
      local_68 = ctx;
      if (local_8c != 0) {
        puVar10 = (ushort *)(local_60.runsv.runsvnum + 2);
        uVar8 = uVar9 - 2;
        local_80 = uVar8;
        do {
          uVar6 = datsiz((uint)*local_88.runsvstr,(byte *)(local_88.runsvnum + 1));
          local_7c = uVar8;
          local_70 = puVar10;
          if (uVar8 != 0) {
            __n = (ulong)(uVar6 + 1);
            do {
              uVar8 = datsiz((uint)(byte)*local_70,(byte *)((long)local_70 + 1));
              __src = local_70;
              if ((uVar6 == uVar8) &&
                 (iVar7 = bcmp(local_88.runsvstr,local_70,__n), puVar5 = local_78, iVar7 == 0)) {
                memcpy(local_78,__src,__n);
                local_78 = puVar5 + __n;
                uVar8 = local_80;
                break;
              }
              lstadv((uchar **)&local_70,&local_7c);
              uVar8 = local_80;
            } while (local_7c != 0);
          }
          lstadv(&local_88.runsvstr,&local_8c);
        } while (local_8c != 0);
      }
      local_40.runsv = (anon_union_8_4_1dda36f5_for_runsv)local_68->runcxhp;
      local_40.runstyp = '\a';
      *(objnum *)local_40.runsv.runsvstr = (short)local_78 - local_40.runsv.runsvobj;
      local_68->runcxhp = local_78;
      runrepush(local_68,&local_40);
      return;
    }
  }
  ctx->runcxerr->errcxptr->erraac = 0;
  runsign(ctx,0x3fc);
}

Assistant:

void bifsct(bifcxdef *bifctx, int argc)
{
    runcxdef *ctx = bifctx->bifcxrun;
    uchar    *l1;
    uchar    *l2;
    uchar    *l3;
    uint      siz1;
    uint      siz2;
    uint      siz3;
    uchar    *p;
    uint      l;
    uint      dsz1;
    uint      dsz2;
    runsdef   val;
    runsdef   stk1, stk2;
    
    bifcntargs(bifctx, 2, argc);
    l1 = runpoplst(ctx);
    siz1 = osrp2(l1);
    l2 = runpoplst(ctx);
    siz2 = osrp2(l2);

    /* make sure the first list is smaller - if not, switch them */
    if (siz1 > siz2)
        l3 = l1, l1 = l2, l2 = l3, siz3 = siz1, siz1 = siz2, siz2 = siz3;
    
    /* size of result is at most size of smaller list (which is now siz1) */
    stk1.runstyp = stk2.runstyp = DAT_LIST;
    stk1.runsv.runsvstr = l1;
    stk2.runsv.runsvstr = l2;
    runhres2(ctx, siz1, 2, &stk1, &stk2);
    l1 = stk1.runsv.runsvstr;
    l2 = stk2.runsv.runsvstr;
    l3 = ctx->runcxhp + 2;

    /* go through list1, and copy each element that is found in list2 */
    for (l1 += 2, l2 += 2, siz1 -= 2, siz2 -= 2 ; siz1 ; lstadv(&l1, &siz1))
    {
        dsz1 = datsiz(*l1, l1 + 1) + 1;
        for (l = siz2, p = l2 ; l ; lstadv(&p, &l))
        {
            dsz2 = datsiz(*p, p + 1) + 1;
#ifndef AMIGA
            if (dsz1 == dsz2 && !memcmp(l1, p, (size_t)dsz1))
#else /* AMIGA */
            if (!memcmp(l1, p, (size_t)dsz1) && (dsz1 == dsz2) )
#endif /* AMIGA */
            {
                memcpy(l3, p, (size_t)dsz1);
                l3 += dsz1;
                break;
            }
        }
    }
    
    /* set up return value, take it out of the heap, and push value */
    val.runsv.runsvstr = ctx->runcxhp;
    val.runstyp = DAT_LIST;
    oswp2(ctx->runcxhp, (uint)(l3 - ctx->runcxhp));
    ctx->runcxhp = l3;
    runrepush(ctx, &val);
}